

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

trap_kind_conflict * lookup_trap(char *desc)

{
  bool bVar1;
  bitflag *pbVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  trap_kind_conflict *local_40;
  trap_kind_conflict *local_38;
  
  if (z_info->trap_max < 2) {
    local_40 = (trap_kind_conflict *)0x0;
  }
  else {
    uVar6 = 1;
    lVar5 = 0x80;
    local_40 = (trap_kind_conflict *)0x0;
    do {
      if (*(long *)(trap_info->flags + lVar5 + -0x68) == 0) {
        bVar1 = false;
      }
      else {
        pcVar4 = *(char **)(trap_info->flags + lVar5 + -0x58);
        pbVar2 = trap_info->flags;
        iVar3 = strcmp(desc,pcVar4);
        if (iVar3 == 0) {
          bVar1 = true;
          local_38 = (trap_kind_conflict *)(pbVar2 + lVar5 + -0x68);
        }
        else {
          bVar1 = false;
          if ((local_40 == (trap_kind_conflict *)0x0) &&
             (pcVar4 = my_stristr(pcVar4,desc),
             local_40 = (trap_kind_conflict *)(pbVar2 + lVar5 + -0x68), pcVar4 == (char *)0x0)) {
            local_40 = (trap_kind_conflict *)0x0;
          }
        }
      }
      if (bVar1) {
        return local_38;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x80;
    } while (uVar6 < z_info->trap_max);
  }
  return local_40;
}

Assistant:

struct trap_kind *lookup_trap(const char *desc)
{
	int i;
	struct trap_kind *closest = NULL;

	/* Look for it */
	for (i = 1; i < z_info->trap_max; i++) {
		struct trap_kind *kind = &trap_info[i];
		if (!kind->name)
			continue;

		/* Test for equality */
		if (streq(desc, kind->desc))
			return kind;

		/* Test for close matches */
		if (!closest && my_stristr(kind->desc, desc))
			closest = kind;
	}

	/* Return our best match */
	return closest;
}